

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::AssertionRemoval::~AssertionRemoval(AssertionRemoval *this)

{
  AssertionRemoval *this_local;
  
  ~AssertionRemoval(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator *gen) override {
        auto stmt_count = gen->stmts_count();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = gen->get_stmt(i);
            if (stmt->type() == StatementType::Assert) stmts_to_remove.emplace_back(stmt);
        }
        for (auto const &stmt : stmts_to_remove) {
            gen->remove_stmt(stmt);
        }
    }